

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O3

size_t gmlc::utilities::getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                 (size_t start,basic_string_view<char,_std::char_traits<char>_> *str,char ChunkStart
                 ,char ChunkEnd)

{
  ulong uVar1;
  char *pcVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar4;
  ulong uVar5;
  size_type __n;
  size_t __n_00;
  ulong uVar6;
  
  uVar1 = str->_M_len;
  pcVar2 = str->_M_str;
  iVar4 = 1;
  do {
    uVar6 = start + 1;
    __n_00 = uVar1 - uVar6;
    if (uVar1 < uVar6 || __n_00 == 0) {
      return 0xffffffffffffffff;
    }
    pvVar3 = memchr(pcVar2 + uVar6,(int)CONCAT71(in_register_00000009,ChunkEnd),__n_00);
    if (pvVar3 == (void *)0x0) {
      return 0xffffffffffffffff;
    }
    uVar5 = (long)pvVar3 - (long)pcVar2;
    if (uVar5 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    pvVar3 = memchr(pcVar2 + uVar6,(int)CONCAT71(in_register_00000011,ChunkStart),__n_00);
    uVar6 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2;
    start = uVar6;
    if (uVar6 >= uVar5) {
      start = uVar5;
    }
    iVar4 = iVar4 + ((uVar6 < uVar5) - 1 | 1);
  } while (iVar4 != 0);
  return start;
}

Assistant:

size_t getChunkEnd(size_t start, const X& str, char ChunkStart, char ChunkEnd)
{
    int open = 1;
    size_t rlc = start;

    while (open > 0) {
        auto newOpen = str.find_first_of(ChunkStart, rlc + 1);
        auto newClose = str.find_first_of(ChunkEnd, rlc + 1);
        if (newClose == X::npos) {
            rlc = X::npos;
            break;
        }
        if (newOpen < newClose) {
            ++open;
            rlc = newOpen;
        } else {
            --open;
            rlc = newClose;
        }
    }
    return rlc;
}